

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::SetupUSDZAssetResolution(AssetResolutionResolver *resolver,USDZAsset *pusdzAsset)

{
  AssetResolutionHandler handler_00;
  AssetResolutionHandler handler_01;
  AssetResolutionHandler handler_02;
  AssetResolutionHandler handler_03;
  AssetResolutionHandler handler_04;
  AssetResolutionHandler handler_05;
  AssetResolutionHandler handler_06;
  AssetResolutionHandler handler_07;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  void *local_2a8;
  allocator local_299;
  string local_298 [32];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  void *local_258;
  allocator local_249;
  string local_248 [32];
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  void *local_208;
  allocator local_1f9;
  string local_1f8 [32];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  void *local_1b8;
  allocator local_1a9;
  string local_1a8 [32];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  void *local_168;
  allocator local_159;
  string local_158 [32];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  void *local_118;
  allocator local_109;
  string local_108 [32];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  void *local_c8;
  allocator local_b9;
  string local_b8 [32];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  void *local_78;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  AssetResolutionHandler handler;
  USDZAsset *pusdzAsset_local;
  AssetResolutionResolver *resolver_local;
  
  if (pusdzAsset != (USDZAsset *)0x0) {
    handler.userdata = pusdzAsset;
    AssetResolutionHandler::AssetResolutionHandler((AssetResolutionHandler *)local_48);
    local_48 = (undefined1  [8])USDZResolveAsset;
    handler.resolve_fun = USDZSizeAsset;
    handler.size_fun = USDZReadAsset;
    handler.read_fun = (FSReadAsset)0x0;
    handler.write_fun = (FSWriteAsset)handler.userdata;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,"png",&local_69);
    memcpy(&local_98,local_48,0x28);
    handler_00.size_fun = (FSSizeAsset)uStack_90;
    handler_00.resolve_fun = (FSResolveAsset)local_98;
    handler_00.read_fun = (FSReadAsset)local_88;
    handler_00.write_fun = (FSWriteAsset)uStack_80;
    handler_00.userdata = local_78;
    AssetResolutionResolver::register_asset_resolution_handler
              (resolver,(string *)local_68,handler_00);
    ::std::__cxx11::string::~string(local_68);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"PNG",&local_b9);
    memcpy(&local_e8,local_48,0x28);
    handler_01.size_fun = (FSSizeAsset)uStack_e0;
    handler_01.resolve_fun = (FSResolveAsset)local_e8;
    handler_01.read_fun = (FSReadAsset)local_d8;
    handler_01.write_fun = (FSWriteAsset)uStack_d0;
    handler_01.userdata = local_c8;
    AssetResolutionResolver::register_asset_resolution_handler
              (resolver,(string *)local_b8,handler_01);
    ::std::__cxx11::string::~string(local_b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_108,"JPG",&local_109);
    memcpy(&local_138,local_48,0x28);
    handler_02.size_fun = (FSSizeAsset)uStack_130;
    handler_02.resolve_fun = (FSResolveAsset)local_138;
    handler_02.read_fun = (FSReadAsset)local_128;
    handler_02.write_fun = (FSWriteAsset)uStack_120;
    handler_02.userdata = local_118;
    AssetResolutionResolver::register_asset_resolution_handler
              (resolver,(string *)local_108,handler_02);
    ::std::__cxx11::string::~string(local_108);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_158,"jpg",&local_159);
    memcpy(&local_188,local_48,0x28);
    handler_03.size_fun = (FSSizeAsset)uStack_180;
    handler_03.resolve_fun = (FSResolveAsset)local_188;
    handler_03.read_fun = (FSReadAsset)local_178;
    handler_03.write_fun = (FSWriteAsset)uStack_170;
    handler_03.userdata = local_168;
    AssetResolutionResolver::register_asset_resolution_handler
              (resolver,(string *)local_158,handler_03);
    ::std::__cxx11::string::~string(local_158);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_159);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1a8,"jpeg",&local_1a9);
    memcpy(&local_1d8,local_48,0x28);
    handler_04.size_fun = (FSSizeAsset)uStack_1d0;
    handler_04.resolve_fun = (FSResolveAsset)local_1d8;
    handler_04.read_fun = (FSReadAsset)local_1c8;
    handler_04.write_fun = (FSWriteAsset)uStack_1c0;
    handler_04.userdata = local_1b8;
    AssetResolutionResolver::register_asset_resolution_handler
              (resolver,(string *)local_1a8,handler_04);
    ::std::__cxx11::string::~string(local_1a8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1f8,"JPEG",&local_1f9);
    memcpy(&local_228,local_48,0x28);
    handler_05.size_fun = (FSSizeAsset)uStack_220;
    handler_05.resolve_fun = (FSResolveAsset)local_228;
    handler_05.read_fun = (FSReadAsset)local_218;
    handler_05.write_fun = (FSWriteAsset)uStack_210;
    handler_05.userdata = local_208;
    AssetResolutionResolver::register_asset_resolution_handler
              (resolver,(string *)local_1f8,handler_05);
    ::std::__cxx11::string::~string(local_1f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_248,"exr",&local_249);
    memcpy(&local_278,local_48,0x28);
    handler_06.size_fun = (FSSizeAsset)uStack_270;
    handler_06.resolve_fun = (FSResolveAsset)local_278;
    handler_06.read_fun = (FSReadAsset)local_268;
    handler_06.write_fun = (FSWriteAsset)uStack_260;
    handler_06.userdata = local_258;
    AssetResolutionResolver::register_asset_resolution_handler
              (resolver,(string *)local_248,handler_06);
    ::std::__cxx11::string::~string(local_248);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_298,"EXR",&local_299);
    memcpy(&local_2c8,local_48,0x28);
    handler_07.size_fun = (FSSizeAsset)uStack_2c0;
    handler_07.resolve_fun = (FSResolveAsset)local_2c8;
    handler_07.read_fun = (FSReadAsset)local_2b8;
    handler_07.write_fun = (FSWriteAsset)uStack_2b0;
    handler_07.userdata = local_2a8;
    AssetResolutionResolver::register_asset_resolution_handler
              (resolver,(string *)local_298,handler_07);
    ::std::__cxx11::string::~string(local_298);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_299);
  }
  return pusdzAsset != (USDZAsset *)0x0;
}

Assistant:

bool SetupUSDZAssetResolution(
  AssetResolutionResolver &resolver,
  const USDZAsset *pusdzAsset)
{
  // https://openusd.org/release/spec_usdz.html
  //
  // [x] Image: png, jpeg(jpg), exr
  //
  // TODO(LTE):
  //
  // [ ] USD: usda, usdc, usd
  // [ ] Audio: m4a, mp3, wav

  if (!pusdzAsset) {
    return false;
  }
  // TODO: Validate Asset data.

  AssetResolutionHandler handler;
  handler.resolve_fun = USDZResolveAsset;
  handler.size_fun = USDZSizeAsset;
  handler.read_fun = USDZReadAsset;
  handler.write_fun = nullptr;
  handler.userdata = reinterpret_cast<void *>(const_cast<USDZAsset *>(pusdzAsset));

  resolver.register_asset_resolution_handler("png", handler);
  resolver.register_asset_resolution_handler("PNG", handler);
  resolver.register_asset_resolution_handler("JPG", handler);
  resolver.register_asset_resolution_handler("jpg", handler);
  resolver.register_asset_resolution_handler("jpeg", handler);
  resolver.register_asset_resolution_handler("JPEG", handler);
  resolver.register_asset_resolution_handler("exr", handler);
  resolver.register_asset_resolution_handler("EXR", handler);

  return true;
}